

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Array<kj::StringPtr> * __thiscall
kj::heapArray<kj::StringPtr,kj::StringPtr_const*>
          (Array<kj::StringPtr> *__return_storage_ptr__,kj *this,StringPtr *begin,StringPtr *end)

{
  undefined1 local_40 [8];
  ArrayBuilder<kj::StringPtr> builder;
  StringPtr *end_local;
  StringPtr *begin_local;
  
  builder.disposer = (ArrayDisposer *)begin;
  heapArrayBuilder<kj::StringPtr>
            ((ArrayBuilder<kj::StringPtr> *)local_40,(long)begin - (long)this >> 4);
  ArrayBuilder<kj::StringPtr>::addAll<kj::StringPtr_const*,false>
            ((ArrayBuilder<kj::StringPtr> *)local_40,(StringPtr *)this,(StringPtr *)builder.disposer
            );
  ArrayBuilder<kj::StringPtr>::finish
            (__return_storage_ptr__,(ArrayBuilder<kj::StringPtr> *)local_40);
  ArrayBuilder<kj::StringPtr>::~ArrayBuilder((ArrayBuilder<kj::StringPtr> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

Array<T>
heapArray(Iterator begin, Iterator end) {
  ArrayBuilder<T> builder = heapArrayBuilder<T>(end - begin);
  builder.addAll(begin, end);
  return builder.finish();
}